

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

RtreeSearchPoint * rtreeEnqueue(RtreeCursor *pCur,RtreeDValue rScore,u8 iLevel)

{
  int iVar1;
  RtreeSearchPoint *pRVar2;
  RtreeSearchPoint *pRVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  
  if (pCur->nPointAlloc <= pCur->nPoint) {
    iVar4 = pCur->nPointAlloc * 2 + 8;
    pRVar3 = pCur->aPoint;
    iVar1 = sqlite3_initialize();
    pRVar2 = (RtreeSearchPoint *)0x0;
    if (iVar1 == 0) {
      uVar6 = iVar4 * 0x18;
      if (0 < (int)uVar6) {
        pRVar2 = (RtreeSearchPoint *)(ulong)uVar6;
      }
      pRVar2 = (RtreeSearchPoint *)sqlite3Realloc(pRVar3,(u64)pRVar2);
    }
    if (pRVar2 == (RtreeSearchPoint *)0x0) {
      return (RtreeSearchPoint *)0x0;
    }
    pCur->aPoint = pRVar2;
    pCur->nPointAlloc = iVar4;
  }
  uVar5 = (ulong)pCur->nPoint;
  pCur->nPoint = pCur->nPoint + 1;
  pRVar3 = pCur->aPoint + uVar5;
  pRVar3->rScore = rScore;
  pRVar3->iLevel = iLevel;
  while( true ) {
    iVar4 = (int)uVar5;
    if (iVar4 < 1) {
      return pRVar3;
    }
    uVar6 = iVar4 - 1U >> 1;
    uVar5 = (ulong)uVar6;
    pRVar2 = pCur->aPoint + uVar5;
    if (pRVar2->rScore <= pRVar3->rScore) {
      bVar7 = true;
      if (pRVar3->rScore <= pRVar2->rScore) {
        bVar7 = pRVar2->iLevel <= pRVar3->iLevel;
      }
    }
    else {
      bVar7 = false;
    }
    if (bVar7) break;
    rtreeSearchPointSwap(pCur,uVar6,iVar4);
    pRVar3 = pRVar2;
  }
  return pRVar3;
}

Assistant:

static RtreeSearchPoint *rtreeEnqueue(
  RtreeCursor *pCur,    /* The cursor */
  RtreeDValue rScore,   /* Score for the new search point */
  u8 iLevel             /* Level for the new search point */
){
  int i, j;
  RtreeSearchPoint *pNew;
  if( pCur->nPoint>=pCur->nPointAlloc ){
    int nNew = pCur->nPointAlloc*2 + 8;
    pNew = sqlite3_realloc(pCur->aPoint, nNew*sizeof(pCur->aPoint[0]));
    if( pNew==0 ) return 0;
    pCur->aPoint = pNew;
    pCur->nPointAlloc = nNew;
  }
  i = pCur->nPoint++;
  pNew = pCur->aPoint + i;
  pNew->rScore = rScore;
  pNew->iLevel = iLevel;
  assert( iLevel<=RTREE_MAX_DEPTH );
  while( i>0 ){
    RtreeSearchPoint *pParent;
    j = (i-1)/2;
    pParent = pCur->aPoint + j;
    if( rtreeSearchPointCompare(pNew, pParent)>=0 ) break;
    rtreeSearchPointSwap(pCur, j, i);
    i = j;
    pNew = pParent;
  }
  return pNew;
}